

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

int __thiscall doctest::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (this->m_str != (char *)0x0) {
    free(this->m_str);
  }
  pcVar2 = *(char **)dst;
  if (pcVar2 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = pcVar2 + -1;
    pcVar3 = pcVar2;
    do {
      pcVar4 = pcVar4 + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  pcVar2 = (char *)malloc((size_t)(pcVar4 + (1 - (long)pcVar2)));
  this->m_str = pcVar2;
  pcVar2 = strcpy(pcVar2,*(char **)dst);
  return (int)pcVar2;
}

Assistant:

void String::copy(const String& other) {
    if(m_str)
        free(m_str);
    m_str = static_cast<char*>(malloc(detail::my_strlen(other.m_str) + 1));
    strcpy(m_str, other.m_str);
}